

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>
               (int *dummy)

{
  EVP_PKEY_CTX *in_RSI;
  anon_class_8_1_3fcf629a local_a8;
  anon_class_8_1_3fcf629a local_a0;
  anon_class_8_1_4513f532 local_98;
  anon_class_8_1_3fcf629a local_90;
  anon_class_8_1_3fcf629a local_88;
  anon_class_8_1_4513f532 local_80;
  anon_class_8_1_3fcf629a local_78;
  anon_class_8_1_3fcf629a local_70;
  anon_class_8_1_4513f532 local_68;
  anon_class_8_1_3fcf629a local_60;
  anon_class_8_1_3fcf629a local_58 [3];
  anon_class_8_1_4513f532 local_40;
  undefined1 local_38 [8];
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> optimizedPtrWithZombiePproperty;
  bool OK;
  int *dummy_local;
  
  optimizedPtrWithZombiePproperty._31_1_ = 1;
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::
  generic_allocated_ptr_and_ptr_and_data_and_flags_
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::init
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38,in_RSI);
  local_40.optimizedPtrWithZombiePproperty =
       (generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x94,&local_40,"!optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  optimizedPtrWithZombiePproperty._31_1_ = 0;
  local_58[0].OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_2_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x96,local_58,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  local_60.OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_3_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x98,&local_60,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::init
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38,
             (EVP_PKEY_CTX *)dummy);
  local_68.optimizedPtrWithZombiePproperty =
       (generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_4_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x9e,&local_68,"!optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  local_70.OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_5_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa0,&local_70,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  local_78.OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_6_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa2,&local_78,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::set_zombie
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  local_80.optimizedPtrWithZombiePproperty =
       (generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_7_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa5,&local_80,"optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  optimizedPtrWithZombiePproperty._31_1_ = 0;
  local_88.OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_8_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa7,&local_88,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  optimizedPtrWithZombiePproperty._31_1_ = 0;
  local_90.OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_9_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa9,&local_90,"OK");
  local_98.optimizedPtrWithZombiePproperty =
       (generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_10_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xad,&local_98,"optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_allocated_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  optimizedPtrWithZombiePproperty._31_1_ = 0;
  local_a0.OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_11_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xaf,&local_a0,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_allocated_ptr
            ((generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> *)local_38);
  optimizedPtrWithZombiePproperty._31_1_ = 0;
  local_a8.OK = (bool *)&optimizedPtrWithZombiePproperty.field_0x1f;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_12_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xb1,&local_a8,"OK");
  return;
}

Assistant:

void testPtrStructsWithZombieProperty_(int* dummy)
{
	bool OK = true;
	TestStructT optimizedPtrWithZombiePproperty;

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init();
	else
		optimizedPtrWithZombiePproperty.init(nullptr);

	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init(dummy, dummy, 17);
	else
		optimizedPtrWithZombiePproperty.init(dummy);
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	optimizedPtrWithZombiePproperty.set_zombie();
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
	{
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
		try { optimizedPtrWithZombiePproperty.get_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
		try { optimizedPtrWithZombiePproperty.get_dereferencable_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	}
}